

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

ConstraintBlockSyntax * __thiscall
slang::parsing::Parser::parseConstraintBlock(Parser *this,bool isTopLevel)

{
  int iVar1;
  undefined4 extraout_var;
  ConstraintBlockSyntax *pCVar2;
  bool bVar3;
  bool bVar4;
  Token openBrace;
  Token TVar5;
  Token closeBrace;
  ConstraintItemSyntax *member;
  SmallVector<slang::syntax::ConstraintItemSyntax_*,_8UL> members;
  Token local_b0;
  Info *local_a0;
  undefined8 local_98;
  SyntaxNode *local_90;
  SyntaxList<slang::syntax::ConstraintItemSyntax> local_88;
  
  Token::Token(&local_b0);
  TVar5 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  local_88.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_88.super_SyntaxListBase.childCount;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = AlwaysBlock;
  local_88.super_SyntaxListBase.super_SyntaxNode._12_4_ = 0;
  bVar3 = false;
  while( true ) {
    local_a0 = TVar5.info;
    local_98 = TVar5._0_8_;
    TVar5 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar5.kind == EndOfFile) || (TVar5.kind == CloseBrace)) break;
    local_90 = &parseConstraintItem(this,false,isTopLevel)->super_SyntaxNode;
    bVar4 = local_90 == (SyntaxNode *)0x0;
    if (bVar4) {
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)((byte)~bVar3 & 1) << 0x20 | 0x350005));
    }
    else {
      checkMemberAllowed(this,local_90,ConstraintBlock);
      SmallVectorBase<slang::syntax::ConstraintItemSyntax*>::
      emplace_back<slang::syntax::ConstraintItemSyntax*const&>
                ((SmallVectorBase<slang::syntax::ConstraintItemSyntax*> *)&local_88,
                 (ConstraintItemSyntax **)&local_90);
    }
    TVar5.info = local_a0;
    TVar5.kind = (undefined2)local_98;
    TVar5._2_1_ = local_98._2_1_;
    TVar5.numFlags.raw = local_98._3_1_;
    TVar5.rawLen = local_98._4_4_;
    bVar3 = bVar4;
  }
  local_b0 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
  iVar1 = SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::ConstraintItemSyntax_*> *)&local_88,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_b0.info);
  local_88.super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>.data_ =
       (pointer)CONCAT44(extraout_var,iVar1);
  if (local_88.super_SyntaxListBase._vptr_SyntaxListBase !=
      (_func_int **)&local_88.super_SyntaxListBase.childCount) {
    free(local_88.super_SyntaxListBase._vptr_SyntaxListBase);
  }
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050b2b0;
  openBrace.info = local_a0;
  openBrace.kind = (undefined2)local_98;
  openBrace._2_1_ = local_98._2_1_;
  openBrace.numFlags.raw = local_98._3_1_;
  openBrace.rawLen = local_98._4_4_;
  pCVar2 = slang::syntax::SyntaxFactory::constraintBlock
                     (&this->factory,openBrace,&local_88,local_b0);
  return pCVar2;
}

Assistant:

ConstraintBlockSyntax& Parser::parseConstraintBlock(bool isTopLevel) {
    Token closeBrace;
    auto openBrace = expect(TokenKind::OpenBrace);
    auto members = parseMemberList<ConstraintItemSyntax>(
        TokenKind::CloseBrace, closeBrace, SyntaxKind::ConstraintBlock,
        [this, isTopLevel](SyntaxKind, bool&) { return parseConstraintItem(false, isTopLevel); });

    return factory.constraintBlock(openBrace, members, closeBrace);
}